

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64func.cpp
# Opt level: O0

Error asmjit::v1_14::a64::FuncInternal::initFuncDetail(FuncDetail *func,FuncSignature *signature)

{
  uint uVar1;
  Error EVar2;
  RegOrder *pRVar3;
  long in_RDI;
  uint32_t size_1;
  RegType regType_2;
  uint32_t regId_1;
  uint32_t size;
  RegType regType_1;
  uint32_t regId;
  TypeId typeId_1;
  FuncValue *arg;
  uint32_t vecPos;
  uint32_t gpzPos;
  RegType regType;
  TypeId typeId;
  uint32_t valueIndex;
  uint32_t minStackArgSize;
  uint32_t argCount;
  uint32_t i;
  uint32_t stackOffset;
  CallConv *cc;
  uint in_stack_fffffffffffffda8;
  undefined2 in_stack_fffffffffffffdac;
  undefined1 in_stack_fffffffffffffdae;
  RegType in_stack_fffffffffffffdaf;
  uint in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb4;
  undefined1 in_stack_fffffffffffffdb5;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  RegMask in_stack_fffffffffffffdc0;
  RegGroup group;
  FuncDetail *in_stack_fffffffffffffdc8;
  uint local_1fc;
  uint local_1f8;
  RegType local_1f2;
  undefined1 local_1f1;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  undefined1 local_1e2;
  undefined1 local_1e1;
  uint local_1e0;
  TypeId local_1d9;
  FuncValue *local_1d8;
  uint local_1d0;
  uint local_1cc;
  RegType local_1c6;
  TypeId local_1c5;
  uint local_1c4;
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  long local_1b0;
  long local_1a0;
  Error local_194;
  long local_178;
  FuncValue *local_160;
  FuncValue *local_158;
  undefined4 local_150;
  TypeId local_149;
  uint local_148;
  RegType local_141;
  FuncDetail *local_140;
  undefined4 local_138;
  TypeId local_131;
  uint local_130;
  undefined1 local_129;
  FuncValue *local_128;
  undefined4 local_120;
  undefined1 local_119;
  uint local_118;
  undefined1 local_111;
  FuncValue *local_110;
  undefined4 local_108;
  undefined1 local_101;
  uint local_100;
  undefined1 local_f9;
  FuncValue *local_f8;
  TypeId local_eb;
  undefined1 local_ea;
  TypeId local_e9;
  uint *local_e8;
  uint *local_e0;
  uint *local_d8;
  uint *local_d0;
  uint *local_c8;
  uint *local_c0;
  TypeId local_b6;
  TypeId local_b5;
  undefined4 local_b4;
  uint local_b0;
  undefined4 local_ac;
  uint local_a8;
  TypeId local_a3;
  TypeId local_a2;
  TypeId local_a1;
  FuncValue *local_a0;
  FuncValue *local_90;
  undefined4 local_88;
  undefined4 local_84;
  uint local_80;
  undefined1 local_7b;
  undefined1 local_7a;
  TypeId local_79;
  undefined4 local_78;
  undefined4 local_74;
  uint local_70;
  undefined1 local_6b;
  undefined1 local_6a;
  TypeId local_69;
  undefined4 local_68;
  undefined4 local_64;
  uint local_60;
  undefined1 local_5b;
  undefined1 local_5a;
  TypeId local_59;
  undefined4 *local_58;
  undefined4 *local_50;
  uint *local_48;
  undefined4 *local_40;
  undefined4 *local_38;
  uint *local_30;
  undefined4 *local_28;
  undefined4 *local_20;
  uint *local_18;
  uint *local_10;
  uint *local_8;
  
  local_1b4 = 0;
  local_1bc = (uint)*(byte *)(in_RDI + 0x74);
  local_1c0 = (uint)(*(char *)(in_RDI + 2) != '\x03') * 4 + 4;
  local_1b0 = in_RDI;
  local_1a0 = in_RDI;
  local_90 = FuncValuePack::operator[]
                       ((FuncValuePack *)
                        CONCAT17(in_stack_fffffffffffffdb7,
                                 CONCAT16(in_stack_fffffffffffffdb6,
                                          CONCAT15(in_stack_fffffffffffffdb5,
                                                   CONCAT14(in_stack_fffffffffffffdb4,
                                                            in_stack_fffffffffffffdb0)))),
                        CONCAT17(in_stack_fffffffffffffdaf,
                                 CONCAT16(in_stack_fffffffffffffdae,
                                          CONCAT24(in_stack_fffffffffffffdac,
                                                   in_stack_fffffffffffffda8))));
  if (local_90->_data != 0) {
    for (local_1c4 = 0; local_1c4 < 4; local_1c4 = local_1c4 + 1) {
      local_158 = FuncValuePack::operator[]
                            ((FuncValuePack *)
                             CONCAT17(in_stack_fffffffffffffdb7,
                                      CONCAT16(in_stack_fffffffffffffdb6,
                                               CONCAT15(in_stack_fffffffffffffdb5,
                                                        CONCAT14(in_stack_fffffffffffffdb4,
                                                                 in_stack_fffffffffffffdb0)))),
                             CONCAT17(in_stack_fffffffffffffdaf,
                                      CONCAT16(in_stack_fffffffffffffdae,
                                               CONCAT24(in_stack_fffffffffffffdac,
                                                        in_stack_fffffffffffffda8))));
      local_1c5 = (TypeId)local_158->_data;
      if (local_1c5 == kVoid) break;
      if (local_1c5 == kInt8) {
LAB_0019905b:
        local_f8 = FuncValuePack::operator[]
                             ((FuncValuePack *)
                              CONCAT17(in_stack_fffffffffffffdb7,
                                       CONCAT16(in_stack_fffffffffffffdb6,
                                                CONCAT15(in_stack_fffffffffffffdb5,
                                                         CONCAT14(in_stack_fffffffffffffdb4,
                                                                  in_stack_fffffffffffffdb0)))),
                              CONCAT17(in_stack_fffffffffffffdaf,
                                       CONCAT16(in_stack_fffffffffffffdae,
                                                CONCAT24(in_stack_fffffffffffffdac,
                                                         in_stack_fffffffffffffda8))));
        local_f9 = 6;
        local_100 = local_1c4;
        local_101 = 0x26;
        local_108 = 0;
        local_f8->_data = local_1c4 << 0x10 | 0x6000126;
      }
      else if (local_1c5 == kUInt8) {
LAB_001990f2:
        local_110 = FuncValuePack::operator[]
                              ((FuncValuePack *)
                               CONCAT17(in_stack_fffffffffffffdb7,
                                        CONCAT16(in_stack_fffffffffffffdb6,
                                                 CONCAT15(in_stack_fffffffffffffdb5,
                                                          CONCAT14(in_stack_fffffffffffffdb4,
                                                                   in_stack_fffffffffffffdb0)))),
                               CONCAT17(in_stack_fffffffffffffdaf,
                                        CONCAT16(in_stack_fffffffffffffdae,
                                                 CONCAT24(in_stack_fffffffffffffdac,
                                                          in_stack_fffffffffffffda8))));
        local_111 = 6;
        local_118 = local_1c4;
        local_119 = 0x27;
        local_120 = 0;
        local_110->_data = local_1c4 << 0x10 | 0x6000127;
      }
      else {
        if (local_1c5 == kInt16) goto LAB_0019905b;
        if (local_1c5 == kUInt16) goto LAB_001990f2;
        if (local_1c5 == kInt32) goto LAB_0019905b;
        if (local_1c5 == kUInt32) goto LAB_001990f2;
        if ((byte)(local_1c5 - kInt64) < 2) {
          local_128 = FuncValuePack::operator[]
                                ((FuncValuePack *)
                                 CONCAT17(in_stack_fffffffffffffdb7,
                                          CONCAT16(in_stack_fffffffffffffdb6,
                                                   CONCAT15(in_stack_fffffffffffffdb5,
                                                            CONCAT14(in_stack_fffffffffffffdb4,
                                                                     in_stack_fffffffffffffdb0)))),
                                 CONCAT17(in_stack_fffffffffffffdaf,
                                          CONCAT16(in_stack_fffffffffffffdae,
                                                   CONCAT24(in_stack_fffffffffffffdac,
                                                            in_stack_fffffffffffffda8))));
          local_129 = 7;
          local_130 = local_1c4;
          local_131 = local_1c5;
          local_138 = 0;
          local_128->_data = local_1c4 << 0x10 | 0x7000000 | (uint)local_1c5 | 0x100;
        }
        else {
          local_1c6 = regTypeFromFpOrVecTypeId(local_1c5);
          if (local_1c6 == kNone) {
            EVar2 = DebugUtils::errored(0x1b);
            return EVar2;
          }
          in_stack_fffffffffffffdc8 =
               (FuncDetail *)
               FuncValuePack::operator[]
                         ((FuncValuePack *)
                          CONCAT17(in_stack_fffffffffffffdb7,
                                   CONCAT16(in_stack_fffffffffffffdb6,
                                            CONCAT15(in_stack_fffffffffffffdb5,
                                                     CONCAT14(in_stack_fffffffffffffdb4,
                                                              in_stack_fffffffffffffdb0)))),
                          CONCAT17(in_stack_fffffffffffffdaf,
                                   CONCAT16(in_stack_fffffffffffffdae,
                                            CONCAT24(in_stack_fffffffffffffdac,
                                                     in_stack_fffffffffffffda8))));
          local_141 = local_1c6;
          local_148 = local_1c4;
          local_149 = local_1c5;
          local_150 = 0;
          *(uint *)in_stack_fffffffffffffdc8 =
               (uint)local_1c6 << 0x18 | local_1c4 << 0x10 | (uint)local_1c5 | 0x100;
          local_140 = in_stack_fffffffffffffdc8;
        }
      }
    }
  }
  local_178 = local_1b0;
  group = *(RegGroup *)(local_1b0 + 2);
  if ((group == k0) || (group == kExtraVirt3)) {
    local_1cc = 0;
    local_1d0 = 0;
    for (local_1b8 = 0; local_1b8 < local_1bc; local_1b8 = local_1b8 + 1) {
      local_1d8 = FuncValuePack::operator[]
                            ((FuncValuePack *)
                             CONCAT17(in_stack_fffffffffffffdb7,
                                      CONCAT16(in_stack_fffffffffffffdb6,
                                               CONCAT15(in_stack_fffffffffffffdb5,
                                                        CONCAT14(in_stack_fffffffffffffdb4,
                                                                 in_stack_fffffffffffffdb0)))),
                             CONCAT17(in_stack_fffffffffffffdaf,
                                      CONCAT16(in_stack_fffffffffffffdae,
                                               CONCAT24(in_stack_fffffffffffffdac,
                                                        in_stack_fffffffffffffda8))));
      uVar1 = local_1d8->_data;
      local_1d9 = (TypeId)uVar1;
      local_5a = 0x20;
      local_5b = 0x29;
      local_60 = uVar1 & 0xff;
      local_64 = 0x20;
      local_68 = 0x29;
      local_48 = &local_60;
      local_50 = &local_64;
      local_58 = &local_68;
      in_stack_fffffffffffffdb7 = 0x1f < local_60 && local_60 < 0x2a;
      local_160 = local_1d8;
      local_eb = local_1d9;
      local_59 = local_1d9;
      if ((bool)in_stack_fffffffffffffdb7) {
        local_1e0 = 0xff;
        if (local_1cc < 0x10) {
          local_1e1 = 0;
          pRVar3 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                   operator[]<asmjit::v1_14::RegGroup>
                             ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)
                              CONCAT17(in_stack_fffffffffffffdb7,
                                       CONCAT16(in_stack_fffffffffffffdb6,
                                                CONCAT15(in_stack_fffffffffffffdb5,
                                                         CONCAT14(in_stack_fffffffffffffdb4,
                                                                  in_stack_fffffffffffffdb0)))),
                              (RegGroup *)
                              CONCAT17(in_stack_fffffffffffffdaf,
                                       CONCAT16(in_stack_fffffffffffffdae,
                                                CONCAT24(in_stack_fffffffffffffdac,
                                                         in_stack_fffffffffffffda8))));
          local_1e0 = (uint)pRVar3->id[local_1cc];
        }
        if (local_1e0 == 0xff) {
          local_b5 = local_1d9;
          local_1ec = (uint)(byte)TypeUtils::_typeData[(ulong)local_1d9 + 0x100];
          local_c0 = &local_1ec;
          local_c8 = &local_1c0;
          in_stack_fffffffffffffdb0 = local_1ec;
          if (local_1ec < local_1c0) {
            in_stack_fffffffffffffdb0 = local_1c0;
          }
          if (7 < in_stack_fffffffffffffdb0) {
            local_a8 = local_1b4;
            local_ac = 8;
            local_1b4 = local_1b4 + 7 & 0xfffffff8;
          }
          local_1e8 = in_stack_fffffffffffffdb0;
          FuncValue::assignStackOffset
                    ((FuncValue *)
                     CONCAT17(in_stack_fffffffffffffdb7,
                              CONCAT16(in_stack_fffffffffffffdb6,
                                       CONCAT15(in_stack_fffffffffffffdb5,
                                                CONCAT14(in_stack_fffffffffffffdb4,
                                                         in_stack_fffffffffffffdb0)))),
                     CONCAT13(in_stack_fffffffffffffdaf,
                              CONCAT12(in_stack_fffffffffffffdae,in_stack_fffffffffffffdac)));
          local_1b4 = local_1e8 + local_1b4;
        }
        else {
          local_e9 = local_1d9;
          local_ea = 0x27;
          in_stack_fffffffffffffdb5 = 7;
          in_stack_fffffffffffffdb6 = 6;
          if (kUInt32 < local_1d9) {
            in_stack_fffffffffffffdb6 = 7;
          }
          local_1e2 = in_stack_fffffffffffffdb6;
          FuncValue::assignRegData
                    ((FuncValue *)
                     CONCAT17(in_stack_fffffffffffffdb7,
                              CONCAT16(in_stack_fffffffffffffdb6,
                                       CONCAT15(7,CONCAT14(in_stack_fffffffffffffdb4,
                                                           in_stack_fffffffffffffdb0)))),
                     in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8);
          local_e0 = &local_1e0;
          local_10 = local_e0;
          FuncDetail::addUsedRegs(in_stack_fffffffffffffdc8,group,in_stack_fffffffffffffdc0);
          local_1cc = local_1cc + 1;
        }
      }
      else {
        local_6a = 0x2a;
        local_6b = 0x2c;
        local_70 = uVar1 & 0xff;
        local_74 = 0x2a;
        local_78 = 0x2c;
        local_30 = &local_70;
        local_38 = &local_74;
        local_40 = &local_78;
        in_stack_fffffffffffffdaf = 0x29 < local_70 && local_70 < 0x2d;
        local_a3 = local_1d9;
        local_69 = local_1d9;
        if (0x29 >= local_70 || local_70 >= 0x2d) {
          local_7a = 0x33;
          local_7b = 100;
          local_80 = uVar1 & 0xff;
          local_84 = 0x33;
          local_88 = 100;
          local_18 = &local_80;
          local_20 = &local_84;
          local_28 = &local_88;
          in_stack_fffffffffffffdae = 0x32 < local_80 && local_80 < 0x65;
          local_a2 = local_1d9;
          local_79 = local_1d9;
          if (0x32 >= local_80 || local_80 >= 0x65) goto LAB_00199a26;
        }
        local_1f0 = 0xff;
        if (local_1d0 < 0x10) {
          local_1f1 = 1;
          pRVar3 = Support::Array<asmjit::v1_14::CallConv::RegOrder,_4UL>::
                   operator[]<asmjit::v1_14::RegGroup>
                             ((Array<asmjit::v1_14::CallConv::RegOrder,_4UL> *)
                              (ulong)CONCAT16(in_stack_fffffffffffffdb6,
                                              CONCAT15(in_stack_fffffffffffffdb5,
                                                       CONCAT14(in_stack_fffffffffffffdb4,
                                                                in_stack_fffffffffffffdb0))),
                              (RegGroup *)
                              CONCAT17(in_stack_fffffffffffffdaf,
                                       CONCAT16(in_stack_fffffffffffffdae,
                                                CONCAT24(in_stack_fffffffffffffdac,
                                                         in_stack_fffffffffffffda8))));
          local_1f0 = (uint)pRVar3->id[local_1d0];
        }
        if (local_1f0 == 0xff) {
          local_b6 = local_1d9;
          local_1fc = (uint)(byte)TypeUtils::_typeData[(ulong)local_1d9 + 0x100];
          local_d0 = &local_1fc;
          local_d8 = &local_1c0;
          in_stack_fffffffffffffda8 = local_1fc;
          if (local_1fc < local_1c0) {
            in_stack_fffffffffffffda8 = local_1c0;
          }
          if (7 < in_stack_fffffffffffffda8) {
            local_b0 = local_1b4;
            local_b4 = 8;
            local_1b4 = local_1b4 + 7 & 0xfffffff8;
          }
          local_1f8 = in_stack_fffffffffffffda8;
          FuncValue::assignStackOffset
                    ((FuncValue *)
                     CONCAT17(in_stack_fffffffffffffdb7,
                              CONCAT16(in_stack_fffffffffffffdb6,
                                       CONCAT15(in_stack_fffffffffffffdb5,
                                                CONCAT14(in_stack_fffffffffffffdb4,
                                                         in_stack_fffffffffffffdb0)))),
                     CONCAT13(in_stack_fffffffffffffdaf,
                              CONCAT12(in_stack_fffffffffffffdae,in_stack_fffffffffffffdac)));
          local_1b4 = local_1f8 + local_1b4;
        }
        else {
          local_1f2 = regTypeFromFpOrVecTypeId(local_1d9);
          if (local_1f2 == kNone) {
            EVar2 = DebugUtils::errored(0x1b);
            return EVar2;
          }
          local_a0 = local_1d8;
          local_a1 = local_1d9;
          local_1d8->_data = (uint)local_1d9;
          FuncValue::assignRegData
                    ((FuncValue *)
                     CONCAT17(in_stack_fffffffffffffdb7,
                              CONCAT16(in_stack_fffffffffffffdb6,
                                       CONCAT15(in_stack_fffffffffffffdb5,
                                                CONCAT14(in_stack_fffffffffffffdb4,
                                                         in_stack_fffffffffffffdb0)))),
                     in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8);
          local_e8 = &local_1f0;
          local_8 = local_e8;
          FuncDetail::addUsedRegs(in_stack_fffffffffffffdc8,group,in_stack_fffffffffffffdc0);
          local_1d0 = local_1d0 + 1;
        }
      }
LAB_00199a26:
    }
    *(uint *)(local_1a0 + 0x88) = local_1b4 + 7 & 0xfffffff8;
    local_194 = 0;
  }
  else {
    local_194 = DebugUtils::errored(3);
  }
  return local_194;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initFuncDetail(FuncDetail& func, const FuncSignature& signature) noexcept {
  DebugUtils::unused(signature);

  const CallConv& cc = func.callConv();
  uint32_t stackOffset = 0;

  uint32_t i;
  uint32_t argCount = func.argCount();

  // Minimum stack size of a single argument passed via stack. The standard AArch64 calling convention
  // specifies 8 bytes, so each function argument would occupy at least 8 bytes even if it needs less.
  // However, Apple has decided to not follow this rule and function argument can occupy less, for
  // example two consecutive 32-bit arguments would occupy 8 bytes total, instead of 16 as specified
  // by ARM.
  uint32_t minStackArgSize = cc.strategy() == CallConvStrategy::kAArch64Apple ? 4u : 8u;

  if (func.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      TypeId typeId = func._rets[valueIndex].typeId();

      // Terminate at the first void type (end of the pack).
      if (typeId == TypeId::kVoid)
        break;

      switch (typeId) {
        case TypeId::kInt8:
        case TypeId::kInt16:
        case TypeId::kInt32: {
          func._rets[valueIndex].initReg(RegType::kARM_GpW, valueIndex, TypeId::kInt32);
          break;
        }

        case TypeId::kUInt8:
        case TypeId::kUInt16:
        case TypeId::kUInt32: {
          func._rets[valueIndex].initReg(RegType::kARM_GpW, valueIndex, TypeId::kUInt32);
          break;
        }

        case TypeId::kInt64:
        case TypeId::kUInt64: {
          func._rets[valueIndex].initReg(RegType::kARM_GpX, valueIndex, typeId);
          break;
        }

        default: {
          RegType regType = regTypeFromFpOrVecTypeId(typeId);
          if (regType == RegType::kNone)
            return DebugUtils::errored(kErrorInvalidRegType);

          func._rets[valueIndex].initReg(regType, valueIndex, typeId);
          break;
        }
      }
    }
  }

  switch (cc.strategy()) {
    case CallConvStrategy::kDefault:
    case CallConvStrategy::kAArch64Apple: {
      uint32_t gpzPos = 0;
      uint32_t vecPos = 0;

      for (i = 0; i < argCount; i++) {
        FuncValue& arg = func._args[i][0];
        TypeId typeId = arg.typeId();

        if (TypeUtils::isInt(typeId)) {
          uint32_t regId = BaseReg::kIdBad;

          if (gpzPos < CallConv::kMaxRegArgsPerGroup)
            regId = cc._passedOrder[RegGroup::kGp].id[gpzPos];

          if (regId != BaseReg::kIdBad) {
            RegType regType = typeId <= TypeId::kUInt32 ? RegType::kARM_GpW : RegType::kARM_GpX;
            arg.assignRegData(regType, regId);
            func.addUsedRegs(RegGroup::kGp, Support::bitMask(regId));
            gpzPos++;
          }
          else {
            uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), minStackArgSize);
            if (size >= 8)
              stackOffset = Support::alignUp(stackOffset, 8);
            arg.assignStackOffset(int32_t(stackOffset));
            stackOffset += size;
          }
          continue;
        }

        if (TypeUtils::isFloat(typeId) || TypeUtils::isVec(typeId)) {
          uint32_t regId = BaseReg::kIdBad;

          if (vecPos < CallConv::kMaxRegArgsPerGroup)
            regId = cc._passedOrder[RegGroup::kVec].id[vecPos];

          if (regId != BaseReg::kIdBad) {
            RegType regType = regTypeFromFpOrVecTypeId(typeId);
            if (regType == RegType::kNone)
              return DebugUtils::errored(kErrorInvalidRegType);

            arg.initTypeId(typeId);
            arg.assignRegData(regType, regId);
            func.addUsedRegs(RegGroup::kVec, Support::bitMask(regId));
            vecPos++;
          }
          else {
            uint32_t size = Support::max<uint32_t>(TypeUtils::sizeOf(typeId), minStackArgSize);
            if (size >= 8)
              stackOffset = Support::alignUp(stackOffset, 8);
            arg.assignStackOffset(int32_t(stackOffset));
            stackOffset += size;
          }
          continue;
        }
      }
      break;
    }

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  func._argStackSize = Support::alignUp(stackOffset, 8u);
  return kErrorOk;
}